

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

sqlite3_mutex * pthreadMutexAlloc(int iType)

{
  pthread_mutex_t *__mutex;
  long in_FS_OFFSET;
  pthread_mutexattr_t recursiveAttr;
  pthread_mutexattr_t local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (iType == 0) {
    __mutex = (pthread_mutex_t *)sqlite3Malloc(0x28);
    if (__mutex != (pthread_mutex_t *)0x0) {
      *(int *)((long)__mutex + 0x10) = 0;
      *(int *)((long)__mutex + 0x14) = 0;
      (__mutex->__data).__list.__prev = (__pthread_internal_list *)0x0;
      __mutex->__align = 0;
      *(int *)((long)__mutex + 8) = 0;
      *(uint *)((long)__mutex + 0xc) = 0;
      (__mutex->__data).__list.__next = (__pthread_internal_list *)0x0;
      pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
      goto LAB_001314c5;
    }
  }
  else {
    if (iType != 1) {
      __mutex = (pthread_mutex_t *)(pthreadMutexAlloc::staticMutexes + (iType + -2));
      goto LAB_001314c5;
    }
    __mutex = (pthread_mutex_t *)sqlite3Malloc(0x28);
    if (__mutex != (pthread_mutex_t *)0x0) {
      *(int *)((long)__mutex + 0x10) = 0;
      *(int *)((long)__mutex + 0x14) = 0;
      (__mutex->__data).__list.__prev = (__pthread_internal_list *)0x0;
      __mutex->__align = 0;
      *(int *)((long)__mutex + 8) = 0;
      *(uint *)((long)__mutex + 0xc) = 0;
      (__mutex->__data).__list.__next = (__pthread_internal_list *)0x0;
      local_1c.__align = -0x55555556;
      pthread_mutexattr_init(&local_1c);
      pthread_mutexattr_settype(&local_1c,1);
      pthread_mutex_init(__mutex,&local_1c);
      pthread_mutexattr_destroy(&local_1c);
      goto LAB_001314c5;
    }
  }
  __mutex = (pthread_mutex_t *)0x0;
LAB_001314c5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (sqlite3_mutex *)__mutex;
  }
  __stack_chk_fail();
}

Assistant:

static sqlite3_mutex *pthreadMutexAlloc(int iType){
  static sqlite3_mutex staticMutexes[] = {
    SQLITE3_MUTEX_INITIALIZER(2),
    SQLITE3_MUTEX_INITIALIZER(3),
    SQLITE3_MUTEX_INITIALIZER(4),
    SQLITE3_MUTEX_INITIALIZER(5),
    SQLITE3_MUTEX_INITIALIZER(6),
    SQLITE3_MUTEX_INITIALIZER(7),
    SQLITE3_MUTEX_INITIALIZER(8),
    SQLITE3_MUTEX_INITIALIZER(9),
    SQLITE3_MUTEX_INITIALIZER(10),
    SQLITE3_MUTEX_INITIALIZER(11),
    SQLITE3_MUTEX_INITIALIZER(12),
    SQLITE3_MUTEX_INITIALIZER(13)
  };
  sqlite3_mutex *p;
  switch( iType ){
    case SQLITE_MUTEX_RECURSIVE: {
      p = sqlite3MallocZero( sizeof(*p) );
      if( p ){
#ifdef SQLITE_HOMEGROWN_RECURSIVE_MUTEX
        /* If recursive mutexes are not available, we will have to
        ** build our own.  See below. */
        pthread_mutex_init(&p->mutex, 0);
#else
        /* Use a recursive mutex if it is available */
        pthread_mutexattr_t recursiveAttr;
        pthread_mutexattr_init(&recursiveAttr);
        pthread_mutexattr_settype(&recursiveAttr, PTHREAD_MUTEX_RECURSIVE);
        pthread_mutex_init(&p->mutex, &recursiveAttr);
        pthread_mutexattr_destroy(&recursiveAttr);
#endif
#if SQLITE_MUTEX_NREF || defined(SQLITE_ENABLE_API_ARMOR)
        p->id = SQLITE_MUTEX_RECURSIVE;
#endif
      }
      break;
    }
    case SQLITE_MUTEX_FAST: {
      p = sqlite3MallocZero( sizeof(*p) );
      if( p ){
        pthread_mutex_init(&p->mutex, 0);
#if SQLITE_MUTEX_NREF || defined(SQLITE_ENABLE_API_ARMOR)
        p->id = SQLITE_MUTEX_FAST;
#endif
      }
      break;
    }
    default: {
#ifdef SQLITE_ENABLE_API_ARMOR
      if( iType-2<0 || iType-2>=ArraySize(staticMutexes) ){
        (void)SQLITE_MISUSE_BKPT;
        return 0;
      }
#endif
      p = &staticMutexes[iType-2];
      break;
    }
  }
#if SQLITE_MUTEX_NREF || defined(SQLITE_ENABLE_API_ARMOR)
  assert( p==0 || p->id==iType );
#endif
  return p;
}